

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cv.c
# Opt level: O1

int cv_dequeue(void *v,nsync_waiter_s *nw)

{
  uint32_t uVar1;
  int iVar2;
  nsync_dll_list_ pnVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = nsync_spin_test_and_set_((nsync_atomic_uint32_ *)v,1,1,0);
  bVar5 = nw->waiting != 0;
  if (bVar5) {
    pnVar3 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 8),&nw->q);
    *(nsync_dll_list_ *)((long)v + 8) = pnVar3;
    nw->waiting = 0;
  }
  iVar2 = nsync_dll_is_empty_(*(nsync_dll_list_ *)((long)v + 8));
  uVar4 = uVar1 & 0xfffffffd;
  if (iVar2 == 0) {
    uVar4 = uVar1;
  }
  *(uint *)v = uVar4;
  return (uint)bVar5;
}

Assistant:

static int cv_dequeue (void *v, struct nsync_waiter_s *nw) {
	nsync_cv *pcv = (nsync_cv *) v;
	int was_queued = 0;
	/* acquire spinlock */
	uint32_t old_word = nsync_spin_test_and_set_ (&pcv->word, CV_SPINLOCK, CV_SPINLOCK, 0);
	if (ATM_LOAD_ACQ (&nw->waiting) != 0) {
		pcv->waiters = nsync_dll_remove_ (pcv->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
		was_queued = 1;
	}
	if (nsync_dll_is_empty_ (pcv->waiters)) {
		old_word &= ~(CV_NON_EMPTY);
	}
	/* Release spinlock. */
	ATM_STORE_REL (&pcv->word, old_word); /* release store */
	return (was_queued);
}